

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bm_utils.c
# Opt level: O0

void read_dist(char *path,char *name,distribution *target)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  void *pvVar4;
  size_t sVar5;
  int *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long name_set;
  long count;
  long weight;
  char *c;
  char token [256];
  char line [256];
  FILE *fp;
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  char *in_stack_fffffffffffffdb0;
  char *s1;
  long local_240;
  long local_238;
  char *local_230;
  char local_228 [256];
  char local_128 [264];
  FILE *local_20;
  int *local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_240 = 0;
  s1 = (char *)0x0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (d_path == (char *)0x0) {
    in_stack_fffffffffffffdb0 = local_128;
    local_8 = in_RDI;
    pcVar2 = env_config((char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                        (char *)0x1028b2);
    sprintf(in_stack_fffffffffffffdb0,"%s%c%s",pcVar2,0x2f,local_8);
    local_20 = fopen64(local_128,"r");
    if (local_20 == (FILE *)0x0) {
      fprintf(_stderr,"Open failed for %s at %s:%d\n",local_128,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/bm_utils.c"
              ,0x114);
      exit(1);
    }
  }
  else {
    local_20 = fopen64(d_path,"r");
    if (local_20 == (FILE *)0x0) {
      fprintf(_stderr,"Open failed for %s at %s:%d\n",d_path,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/bm_utils.c"
              ,0x119);
      exit(1);
    }
  }
  while( true ) {
    while( true ) {
      do {
        pcVar2 = fgets(local_128,0x100,local_20);
        if (pcVar2 == (char *)0x0) {
          if (local_240 == *local_18) {
            local_18[4] = 0;
            local_18[5] = 0;
            fclose(local_20);
            return;
          }
          fprintf(_stderr,"Read error on dist \'%s\'\n",local_10);
          fclose(local_20);
          exit(1);
        }
        local_230 = strchr(local_128,10);
        if (local_230 != (char *)0x0) {
          *local_230 = '\0';
        }
        local_230 = strchr(local_128,0x23);
        if (local_230 != (char *)0x0) {
          *local_230 = '\0';
        }
      } while (local_128[0] == '\0');
      if (s1 != (char *)0x0) break;
      strtok(local_128,"\n\t ");
      lVar3 = dsscasecmp(s1,in_stack_fffffffffffffdb0);
      if (lVar3 == 0) {
        strtok((char *)0x0,"\n\t ");
        lVar3 = dsscasecmp(s1,in_stack_fffffffffffffdb0);
        if (lVar3 == 0) {
          s1 = (char *)0x1;
        }
      }
    }
    lVar3 = dssncasecmp(s1,in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
    if (lVar3 == 0) break;
    iVar1 = __isoc99_sscanf(local_128,"%[^|]|%ld",local_228,&local_238);
    if (iVar1 == 2) {
      lVar3 = dsscasecmp(s1,in_stack_fffffffffffffdb0);
      if (lVar3 == 0) {
        *local_18 = (int)local_238;
        pvVar4 = malloc(local_238 << 4);
        *(void **)(local_18 + 2) = pvVar4;
        if (*(long *)(local_18 + 2) == 0) {
          fprintf(_stderr,"Malloc failed at %s:%d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/bm_utils.c"
                  ,0x13f);
          exit(1);
        }
        local_18[1] = 0;
      }
      else {
        sVar5 = strlen(local_228);
        pvVar4 = malloc((long)((int)sVar5 + 1));
        *(void **)(*(long *)(local_18 + 2) + local_240 * 0x10 + 8) = pvVar4;
        if (*(long *)(*(long *)(local_18 + 2) + local_240 * 0x10 + 8) == 0) {
          fprintf(_stderr,"Malloc failed at %s:%d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/bm_utils.c"
                  ,0x145);
          exit(1);
        }
        strcpy(*(char **)(*(long *)(local_18 + 2) + local_240 * 0x10 + 8),local_228);
        local_18[1] = local_18[1] + (int)local_238;
        *(long *)(*(long *)(local_18 + 2) + local_240 * 0x10) = (long)local_18[1];
        local_240 = local_240 + 1;
      }
    }
  }
  fclose(local_20);
  return;
}

Assistant:

void
read_dist(char *path, char *name, distribution *target)
{
FILE     *fp;
char      line[256],
         token[256],
        *c;
long      weight,
         count = 0,
         name_set = 0;

    if (d_path == NULL)
		{
		sprintf(line, "%s%c%s", 
			env_config(CONFIG_TAG, CONFIG_DFLT), PATH_SEP, path);
		fp = fopen(line, "r");
		OPEN_CHECK(fp, line);
		}
	else
		{
		fp = fopen(d_path, "r");
		OPEN_CHECK(fp, d_path);
		}
    while (fgets(line, sizeof(line), fp) != NULL)
        {
        if ((c = strchr(line, '\n')) != NULL)
            *c = '\0';
        if ((c = strchr(line, '#')) != NULL)
            *c = '\0';
        if (*line == '\0')
            continue;

        if (!name_set)
            {
            if (dsscasecmp(strtok(line, "\n\t "), "BEGIN"))
                continue;
            if (dsscasecmp(strtok(NULL, "\n\t "), name))
                continue;
            name_set = 1;
            continue;
            }
        else
            {
            if (!dssncasecmp(line, "END", 3))
                {
                fclose(fp);
                return;
                }
            }

        if (sscanf(line, "%[^|]|%ld", token, &weight) != 2)
            continue;

        if (!dsscasecmp(token, "count"))
            {
            target->count = weight;
            target->list =
                (set_member *)
                    malloc((size_t)(weight * sizeof(set_member)));
            MALLOC_CHECK(target->list);
            target->max = 0;
            continue;
            }
        target->list[count].text =
            (char *) malloc((size_t)((int)strlen(token) + 1));
        MALLOC_CHECK(target->list[count].text);
        strcpy(target->list[count].text, token);
        target->max += weight;
        target->list[count].weight = target->max;

        count += 1;
        } /* while fgets() */

    if (count != target->count)
        {
        fprintf(stderr, "Read error on dist '%s'\n", name);
        fclose(fp);
        exit(1);
        }
	target->permute = (long *)NULL;
    fclose(fp);
    return;
}